

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.cpp
# Opt level: O0

void __thiscall AsyncLogging::AsyncLogging(AsyncLogging *this,string *logName,int flushInterval)

{
  FixedBuffer<4000000> *this_00;
  ulong uVar1;
  element_type *this_01;
  size_t __n;
  void *__s;
  allocator local_a1;
  string local_a0;
  AsyncLogging *local_80;
  code *local_78;
  undefined8 local_70;
  type local_68;
  ThreadFunc local_50;
  int local_1c;
  string *psStack_18;
  int flushInterval_local;
  string *logName_local;
  AsyncLogging *this_local;
  
  local_1c = flushInterval;
  psStack_18 = logName;
  logName_local = (string *)this;
  noncopyable::noncopyable((noncopyable *)this);
  this->flushInterval_ = local_1c;
  this->running_ = false;
  std::__cxx11::string::string((string *)&this->basename_,(string *)logName);
  local_78 = threadFunc;
  local_70 = 0;
  local_80 = this;
  std::bind<void(AsyncLogging::*)(),AsyncLogging*>
            (&local_68,(offset_in_AsyncLogging_to_subr *)&local_78,&local_80);
  std::function<void()>::function<std::_Bind<void(AsyncLogging::*(AsyncLogging*))()>,void>
            ((function<void()> *)&local_50,&local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"Logging",&local_a1);
  Thread::Thread(&this->thread_,&local_50,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::function<void_()>::~function(&local_50);
  MutexLock::MutexLock(&this->mutex_);
  Condition::Condition(&this->cond_,&this->mutex_);
  this_00 = (FixedBuffer<4000000> *)operator_new(0x3d0908);
  FixedBuffer<4000000>::FixedBuffer(this_00);
  std::shared_ptr<FixedBuffer<4000000>>::shared_ptr<FixedBuffer<4000000>,void>
            ((shared_ptr<FixedBuffer<4000000>> *)&this->currentBuffer_,this_00);
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffers_).
  super__Vector_base<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::vector(&this->buffers_);
  __s = (void *)0x1;
  CountDownLatch::CountDownLatch(&this->latch_,1);
  uVar1 = std::__cxx11::string::size();
  if (1 < uVar1) {
    this_01 = std::
              __shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->currentBuffer_);
    FixedBuffer<4000000>::bzero(this_01,__s,__n);
    std::
    vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
    ::reserve(&this->buffers_,0x10);
    return;
  }
  __assert_fail("logName.size() > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/base/AsyncLogging.cpp"
                ,0x10,"AsyncLogging::AsyncLogging(std::string, int)");
}

Assistant:

AsyncLogging::AsyncLogging(std::string logName, int flushInterval) 
    : flushInterval_(flushInterval),
      running_(false),
      basename_(logName),
      thread_(std::bind(&AsyncLogging::threadFunc, this), "Logging"),
      mutex_(),
      cond_(mutex_), 
      currentBuffer_(new Buffer),
      buffers_(),
      latch_(1) {
    assert(logName.size() > 1);
    currentBuffer_->bzero();
    buffers_.reserve(16);
}